

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * __thiscall Pathie::Path::make_tempname(Path *this,string *namepart)

{
  __pid_t _Var1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268 [39];
  allocator local_241;
  string local_240 [8];
  string randompart;
  short local_21a;
  string local_218 [6];
  short i;
  string pidpart;
  stringstream local_1f8 [8];
  stringstream ss;
  undefined1 local_1e8 [399];
  allocator local_59;
  string local_58 [8];
  string timepart;
  char acStack_38 [8];
  char buf [16];
  tm *p_nowinfo;
  time_t now;
  string *namepart_local;
  
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  now = (time_t)namepart;
  namepart_local = &this->m_path;
  time((time_t *)&p_nowinfo);
  buf._8_8_ = localtime((time_t *)&p_nowinfo);
  acStack_38[0] = '\0';
  acStack_38[1] = '\0';
  acStack_38[2] = '\0';
  acStack_38[3] = '\0';
  acStack_38[4] = '\0';
  acStack_38[5] = '\0';
  acStack_38[6] = '\0';
  acStack_38[7] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  strftime(acStack_38,0x10,"%Y%m%d-%H%M%S",(tm *)buf._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,acStack_38,0xf,&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::__cxx11::stringstream::stringstream(local_1f8);
  _Var1 = getpid();
  std::ostream::operator<<(local_1e8,_Var1);
  std::__cxx11::stringstream::str();
  memset(acStack_38,0,0x10);
  for (local_21a = 0; local_21a < 0x10; local_21a = local_21a + 1) {
    iVar2 = rand();
    buf[(long)local_21a + -8] = (char)(iVar2 % 0x1a) + 'a';
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,acStack_38,0xf,&local_241);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::operator+(local_2a8,(char *)now);
  std::operator+(local_288,local_2a8);
  std::operator+(local_268,local_288);
  std::operator+(&this->m_path,local_268);
  std::__cxx11::string::~string((string *)local_268);
  std::__cxx11::string::~string((string *)local_288);
  std::__cxx11::string::~string((string *)local_2a8);
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::stringstream::~stringstream(local_1f8);
  std::__cxx11::string::~string(local_58);
  return this;
}

Assistant:

std::string Path::make_tempname(const std::string& namepart)
{
  time_t now;
  struct tm* p_nowinfo = NULL;
  time(&now);
  p_nowinfo = localtime(&now);

  char buf[16]; // 15 + NUL
  memset(buf, '\0', 16);
  strftime(buf, 16, "%Y%m%d-%H%M%S", p_nowinfo);
  std::string timepart(buf, 15);

#if defined(_PATHIE_UNIX)
  std::stringstream ss;
  ss << getpid();
  std::string pidpart = ss.str();
#elif defined(_WIN32)
  std::stringstream ss;
  ss << GetCurrentProcessId();
  std::string pidpart = ss.str();
#else
#error Unsupported system.
#endif

  memset(buf, '\0', 16);
  short i;
  for(i=0; i < 16; i++)
    buf[i] = 97 + rand() % 26; // Random char between a and z

  std::string randompart(buf, 15);

  return namepart + "_" + timepart + pidpart + randompart;
}